

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O1

void __thiscall skiwi::anon_unknown_23::foreign_call_6::~foreign_call_6(foreign_call_6 *this)

{
  compile_fixture::~compile_fixture(&this->super_compile_fixture);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      external_function ef;
      ef.name = "get_a_text";
      ef.address = (uint64_t)&get_a_text;
      ef.return_type = external_function::T_CHAR_POINTER;
      externals[ef.name] = ef;
      TEST_EQ("\"This is a text\"", run("(foreign-call get_a_text)"));
      }